

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1239:42)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1239:42)>
          *this,ExceptionOrValue *output)

{
  int *piVar1;
  undefined8 uVar2;
  int local_398;
  int local_394;
  DebugComparison<int,_int> _kjCondition;
  ExceptionOr<kj::_::Void> local_370;
  ExceptionOr<kj::_::Void> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  uVar2 = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr;
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    local_370.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.file;
    local_370.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1._32_8_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar2;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_370.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),0x105);
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0
    ;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         (Detail *)0x0;
    local_370.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_370);
  }
  else {
    if (depResult.value.ptr.isSet != true) goto LAB_0019bdcb;
    piVar1 = (this->func).counter;
    _kjCondition.right = *piVar1;
    *piVar1 = _kjCondition.right + 1;
    _kjCondition.left = 1;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.right == 1;
    if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
      local_394 = 1;
      *piVar1 = _kjCondition.right + 2;
      local_398 = _kjCondition.right + 1;
      Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x4d8,ERROR,
                 "\"failed: expected \" \"(1) == (counter++)\", _kjCondition, 1, counter++",
                 (char (*) [36])"failed: expected (1) == (counter++)",&_kjCondition,&local_394,
                 &local_398);
    }
    local_370.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_370.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_370);
  }
  if (local_370.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_370.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_0019bdcb:
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }